

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::
unordered_flat_set<std::pair<unsigned_int,unsigned_int>,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
::insert<std::pair<unsigned_int,unsigned_int>const*>
          (unordered_flat_set<std::pair<unsigned_int,unsigned_int>,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
           *this,pair<unsigned_int,_unsigned_int> *first,pair<unsigned_int,_unsigned_int> *last)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  uint uVar4;
  size_t hash;
  ulong pos0;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  pair<unsigned_int,_unsigned_int> *pos;
  char cVar9;
  char cVar10;
  char cVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  locator local_48;
  
  do {
    if (first == last) {
      return;
    }
    hash = slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>::operator()
                     ((hash<std::pair<unsigned_int,_unsigned_int>,_void> *)this,first);
    pos0 = hash >> ((byte)*this & 0x3f);
    uVar3 = (&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
              match_word(unsigned_long)::word)[hash & 0xff];
    uVar7 = 0;
    uVar6 = pos0;
    do {
      pcVar1 = (char *)(*(long *)(this + 0x10) + uVar6 * 0x10);
      cVar9 = (char)uVar3;
      auVar13[0] = -(*pcVar1 == cVar9);
      cVar10 = (char)((uint)uVar3 >> 8);
      auVar13[1] = -(pcVar1[1] == cVar10);
      cVar11 = (char)((uint)uVar3 >> 0x10);
      auVar13[2] = -(pcVar1[2] == cVar11);
      bVar12 = (byte)((uint)uVar3 >> 0x18);
      auVar13[3] = -(pcVar1[3] == bVar12);
      auVar13[4] = -(pcVar1[4] == cVar9);
      auVar13[5] = -(pcVar1[5] == cVar10);
      auVar13[6] = -(pcVar1[6] == cVar11);
      auVar13[7] = -(pcVar1[7] == bVar12);
      auVar13[8] = -(pcVar1[8] == cVar9);
      auVar13[9] = -(pcVar1[9] == cVar10);
      auVar13[10] = -(pcVar1[10] == cVar11);
      auVar13[0xb] = -(pcVar1[0xb] == bVar12);
      auVar13[0xc] = -(pcVar1[0xc] == cVar9);
      auVar13[0xd] = -(pcVar1[0xd] == cVar10);
      auVar13[0xe] = -(pcVar1[0xe] == cVar11);
      auVar13[0xf] = -(pcVar1[0xf] == bVar12);
      uVar8 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
      if (uVar8 != 0) {
        do {
          uVar4 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          uVar2 = *(undefined8 *)(*(long *)(this + 0x18) + uVar6 * 0x78 + (ulong)uVar4 * 8);
          auVar14._0_4_ = -(uint)((uint)uVar2 == (*first).first);
          iVar15 = -(uint)((uint)((ulong)uVar2 >> 0x20) == (*first).second);
          auVar14._4_4_ = auVar14._0_4_;
          auVar14._8_4_ = iVar15;
          auVar14._12_4_ = iVar15;
          iVar15 = movmskpd(uVar4,auVar14);
          if (iVar15 == 3) goto LAB_001c8698;
          uVar8 = uVar8 - 1 & uVar8;
        } while (uVar8 != 0);
      }
      if (((&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & pcVar1[0xf]) == 0) break;
      lVar5 = uVar6 + uVar7;
      uVar7 = uVar7 + 1;
      uVar6 = lVar5 + 1U & *(ulong *)(this + 8);
    } while (uVar7 <= *(ulong *)(this + 8));
    if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x20)) {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::unchecked_emplace_at<std::pair<unsigned_int,unsigned_int>const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                  *)this,pos0,hash,first);
    }
    else {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::unchecked_emplace_with_rehash<std::pair<unsigned_int,unsigned_int>const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,unsigned_int>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                  *)this,hash,first);
    }
LAB_001c8698:
    first = first + 1;
  } while( true );
}

Assistant:

void insert(InputIterator first, InputIterator last) {
        for (auto pos = first; pos != last; ++pos) {
            table_.emplace(*pos);
        }
    }